

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void us_socket_context_on_close
               (int ssl,us_socket_context_t *context,_func_us_socket_t_ptr_us_socket_t_ptr *on_close
               )

{
  if (ssl != 0) {
    us_internal_ssl_socket_context_on_close
              ((us_internal_ssl_socket_context_t *)context,
               (_func_us_internal_ssl_socket_t_ptr_us_internal_ssl_socket_t_ptr *)on_close);
    return;
  }
  context->on_close = on_close;
  return;
}

Assistant:

void us_socket_context_on_close(int ssl, struct us_socket_context_t *context, struct us_socket_t *(*on_close)(struct us_socket_t *s)) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_context_on_close((struct us_internal_ssl_socket_context_t *) context, (struct us_internal_ssl_socket_t * (*)(struct us_internal_ssl_socket_t *)) on_close);
        return;
    }
#endif

    context->on_close = on_close;
}